

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getDesc_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  string *psVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  pointer pAVar7;
  bool bVar8;
  stringstream desc;
  allocator<char> local_221;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pAVar7 = (this->arrays).
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arrays).
      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar7) {
    lVar4 = 0x1c;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Array ",6);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Storage in ",0xb);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,
                 Array::storageToString::storages[*(int *)((long)pAVar7 + lVar4 + -0x14)],
                 (allocator<char> *)&local_200);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_1e0,local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"stride ",7);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)pAVar7 + lVar4 + -4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"input datatype ",0xf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 Array::inputTypeToString::types[*(int *)((long)pAVar7 + lVar4 + -0x1c)],
                 (allocator<char> *)&local_220);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_200,local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"input component count ",0x16);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)pAVar7 + lVar4 + -0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      bVar8 = *(char *)((long)&pAVar7->inputType + lVar4) != '\0';
      pcVar5 = "";
      if (bVar8) {
        pcVar5 = "normalized, ";
      }
      lVar3 = 0;
      if (bVar8) {
        lVar3 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"used as ",8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,
                 Array::outputTypeToString::types[*(int *)((long)pAVar7 + lVar4 + -0x18)],&local_221
                );
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_220,local_218);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      uVar6 = uVar6 + 1;
      pAVar7 = (this->arrays).
               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x40;
    } while (uVar6 < (ulong)((long)(this->arrays).
                                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 6));
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawArrays(), ",0xe);
  psVar1 = local_1c0;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"first ",6);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a8,this->first);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::ostream::operator<<(poVar2,this->drawCount);
  if (this->primitive == PRIMITIVE_POINTS) {
    pcVar5 = "points";
  }
  else {
    if (this->primitive != PRIMITIVE_TRIANGLES) goto LAB_0095e933;
    pcVar5 = "quads ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar5,6);
LAB_0095e933:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		desc
			<< "Array " << ndx << ": "
			<< "Storage in " << Array::storageToString(array.storage) << ", "
			<< "stride " << array.stride << ", "
			<< "input datatype " << Array::inputTypeToString((Array::InputType)array.inputType) << ", "
			<< "input component count " << array.componentCount << ", "
			<< (array.normalize ? "normalized, " : "")
			<< "used as " << Array::outputTypeToString(array.outputType) << ", ";
	}

	desc
		<< "drawArrays(), "
		<< "first " << first << ", "
		<< drawCount;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			desc << "quads ";
			break;
		case Array::PRIMITIVE_POINTS:
			desc << "points";
			break;

		default:
			DE_ASSERT(false);
			break;
	}


	return desc.str();
}